

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O2

void __thiscall bsplib::Rdma::write_gets(Rdma *this)

{
  A2A *this_00;
  size_t size_00;
  int p;
  int src_pid;
  long lVar1;
  size_t size;
  size_t slot;
  size_t local_38;
  unsigned_long local_30;
  
  this_00 = &this->m_second_exchange;
  for (lVar1 = 0; lVar1 < this->m_nprocs; lVar1 = lVar1 + 1) {
    size_00 = (this->m_recv_actions).m_get_buffer_offset.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar1];
    while( true ) {
      src_pid = (int)lVar1;
      A2A::recv_pop(this_00,src_pid,size_00);
      if ((this->m_second_exchange).m_recv_sizes.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar1] ==
          (this->m_second_exchange).m_recv_pos.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar1]) break;
      deserial<unsigned_long>(this_00,src_pid,&local_38);
      deserial<unsigned_long>(this_00,src_pid,&local_30);
      memcpy((this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start[local_30],
             (this->m_second_exchange).m_recv_bufs.super__Vector_base<char,_std::allocator<char>_>.
             _M_impl.super__Vector_impl_data._M_start +
             (this->m_second_exchange).m_recv_pos.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[lVar1] + (this->m_second_exchange).m_recv_cap * lVar1,
             local_38);
      size_00 = local_38;
    }
  }
  return;
}

Assistant:

void Rdma::write_gets()
{
#ifdef PROFILE
    TicToc t(TicToc::GET );
#endif
    for (int p = 0; p < m_nprocs; ++p){
        size_t start = m_recv_actions.m_get_buffer_offset[p];
        m_second_exchange.recv_pop( p, start );
        while ( m_second_exchange.recv_size( p ) > 0 ) {
            size_t size, slot;
            deserial( m_second_exchange, p, size );
            deserial( m_second_exchange, p, slot);
           
            char * dst_addr = static_cast<char *>(m_local_slots[ slot ]);

            std::memcpy( dst_addr, m_second_exchange.recv_top(p), size );
            m_second_exchange.recv_pop(p, size );
        }
#ifdef PROFILE
        size_t end = m_second_exchange.recv_pos(p);
        t.add_bytes( end - start );
#endif
   }
}